

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCec.c
# Opt level: O2

int Fra_FraigCecPartitioned
              (Aig_Man_t *pMan1,Aig_Man_t *pMan2,int nConfLimit,int nPartSize,int fSmart,
              int fVerbose)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Ptr_t *p;
  Aig_Man_t *pAVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  Aig_Man_t *local_38;
  
  p = Aig_ManMiterPartitioned(pMan1,pMan2,nPartSize,fSmart);
  uVar9 = 0xffffffffffffffff;
  uVar10 = 0;
  while( true ) {
    iVar6 = (int)uVar10;
    if ((long)p->nSize <= (long)uVar10) break;
    pAVar7 = (Aig_Man_t *)Vec_PtrEntry(p,iVar6);
    local_38 = pAVar7;
    if (fVerbose != 0) {
      uVar1 = p->nSize;
      uVar2 = pAVar7->nObjs[2];
      uVar3 = pAVar7->nObjs[3];
      iVar8 = pAVar7->nObjs[6];
      iVar4 = pAVar7->nObjs[5];
      iVar5 = Aig_ManLevelNum(pAVar7);
      printf("Verifying part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r",
             (ulong)(iVar6 + 1),(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)(uint)(iVar8 + iVar4),
             iVar5);
      fflush(_stdout);
    }
    uVar9 = (ulong)((int)uVar9 + 1);
    iVar6 = Fra_FraigMiterStatus(pAVar7);
    if (iVar6 != 1) {
      if (iVar6 == 0) goto LAB_004f27ce;
      iVar6 = Fra_FraigCec(&local_38,nConfLimit,0);
      if ((long)p->nSize <= (long)uVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      p->pArray[uVar10] = local_38;
      if (iVar6 != 1) goto LAB_004f27cb;
    }
    uVar10 = uVar10 + 1;
  }
  uVar10 = (ulong)(iVar6 - 1);
  iVar6 = 1;
LAB_004f27cb:
  uVar9 = uVar10 & 0xffffffff;
LAB_004f27ce:
  if (fVerbose != 0) {
    printf(
          "                                                                                          \r"
          );
    fflush(_stdout);
  }
  if (iVar6 == -1) {
    printf("Timed out after verifying %d partitions (out of %d).\n",uVar9,(ulong)(uint)p->nSize);
    fflush(_stdout);
  }
  for (iVar8 = 0; iVar8 < p->nSize; iVar8 = iVar8 + 1) {
    pAVar7 = (Aig_Man_t *)Vec_PtrEntry(p,iVar8);
    Aig_ManStop(pAVar7);
  }
  free(p->pArray);
  free(p);
  return iVar6;
}

Assistant:

int Fra_FraigCecPartitioned( Aig_Man_t * pMan1, Aig_Man_t * pMan2, int nConfLimit, int nPartSize, int fSmart, int fVerbose )
{
    Aig_Man_t * pAig;
    Vec_Ptr_t * vParts;
    int i, RetValue = 1, nOutputs;
    // create partitions
    vParts = Aig_ManMiterPartitioned( pMan1, pMan2, nPartSize, fSmart );
    // solve the partitions
    nOutputs = -1;
    Vec_PtrForEachEntry( Aig_Man_t *, vParts, pAig, i )
    {
        nOutputs++;
        if ( fVerbose )
        {
            printf( "Verifying part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r", 
                i+1, Vec_PtrSize(vParts), Aig_ManCiNum(pAig), Aig_ManCoNum(pAig), 
                Aig_ManNodeNum(pAig), Aig_ManLevelNum(pAig) );
            fflush( stdout );
        }
        RetValue = Fra_FraigMiterStatus( pAig );
        if ( RetValue == 1 )
            continue;
        if ( RetValue == 0 )
            break;
        RetValue = Fra_FraigCec( &pAig, nConfLimit, 0 );
        Vec_PtrWriteEntry( vParts, i, pAig );
        if ( RetValue == 1 )
            continue;
        if ( RetValue == 0 )
            break;
        break;
    }
    // clear the result
    if ( fVerbose )
    {
        printf( "                                                                                          \r" );
        fflush( stdout );
    }
    // report the timeout
    if ( RetValue == -1 )
    {
        printf( "Timed out after verifying %d partitions (out of %d).\n", nOutputs, Vec_PtrSize(vParts) );
        fflush( stdout );
    }
    // free intermediate results
    Vec_PtrForEachEntry( Aig_Man_t *, vParts, pAig, i )
        Aig_ManStop( pAig );
    Vec_PtrFree( vParts );
    return RetValue;
}